

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

Type * __thiscall soul::AST::ConcreteType::resolveAsType(ConcreteType *this)

{
  Structure *pSVar1;
  Category CVar2;
  bool bVar3;
  bool bVar4;
  PrimitiveType PVar5;
  BoundedIntSize BVar6;
  Type *in_RDI;
  
  CVar2 = (this->type).arrayElementCategory;
  bVar3 = (this->type).isRef;
  bVar4 = (this->type).isConstant;
  PVar5.type = (this->type).primitiveType.type;
  in_RDI->category = (this->type).category;
  in_RDI->arrayElementCategory = CVar2;
  in_RDI->isRef = bVar3;
  in_RDI->isConstant = bVar4;
  in_RDI->primitiveType = (PrimitiveType)PVar5.type;
  BVar6 = (this->type).arrayElementBoundingSize;
  in_RDI->boundingSize = (this->type).boundingSize;
  in_RDI->arrayElementBoundingSize = BVar6;
  pSVar1 = (this->type).structure.object;
  (in_RDI->structure).object = pSVar1;
  if (pSVar1 != (Structure *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  return in_RDI;
}

Assistant:

Type resolveAsType() const override             { return type; }